

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseBlockInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  char **this_00;
  Expr *pEVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  TokenType TVar7;
  Result RVar8;
  Expr *pEVar9;
  undefined **ppuVar10;
  Block *pBVar11;
  Location loc;
  Var var;
  CatchVector catches;
  Var local_b0;
  vector<wabt::Catch,_std::allocator<wabt::Catch>_> local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  GetToken((Token *)&local_b0,this);
  uVar5 = local_b0.loc.field_1._8_8_;
  uVar4 = local_b0.loc.field_1.field_1.offset;
  pcVar3 = local_b0.loc.filename._M_str;
  sVar2 = local_b0.loc.filename._M_len;
  TVar7 = Peek(this,0);
  if ((int)TVar7 < 0x58) {
    if (TVar7 == Block) {
      Consume((Token *)&local_b0,this);
      pEVar9 = (Expr *)operator_new(0x188);
      (pEVar9->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      (pEVar9->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      (pEVar9->loc).filename._M_len = sVar2;
      (pEVar9->loc).filename._M_str = pcVar3;
      (pEVar9->loc).field_1.field_1.offset = uVar4;
      *(undefined8 *)((long)&(pEVar9->loc).field_1 + 8) = uVar5;
      pEVar9->type_ = Block;
      ppuVar10 = &PTR__BlockExprBase_0019b048;
      goto LAB_0013ce85;
    }
    if (TVar7 != If) {
LAB_0013d093:
      __assert_fail("!\"ParseBlockInstr should only be called when IsBlockInstr() is true\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                    ,0xb56,"Result wabt::WastParser::ParseBlockInstr(std::unique_ptr<Expr> *)");
    }
    Consume((Token *)&local_b0,this);
    pEVar9 = (Expr *)operator_new(0x1c0);
    (pEVar9->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar9->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar9->loc).filename._M_len = sVar2;
    (pEVar9->loc).filename._M_str = pcVar3;
    (pEVar9->loc).field_1.field_1.offset = uVar4;
    *(undefined8 *)((long)&(pEVar9->loc).field_1 + 8) = uVar5;
    pEVar9->type_ = If;
    pEVar9->_vptr_Expr = (_func_int **)&PTR__IfExpr_0019b0e8;
    pBVar11 = (Block *)(pEVar9 + 1);
    Block::Block(pBVar11);
    pEVar9[6].loc.field_1.field_1.offset = 0;
    *(undefined8 *)((long)&pEVar9[6].loc.field_1 + 8) = 0;
    pEVar9[6].loc.filename._M_len = 0;
    pEVar9[6].loc.filename._M_str = (char *)0x0;
    pEVar9[6].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
    pEVar9[6].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
    pEVar9[6].type_ = AtomicLoad;
    RVar8 = ParseLabelOpt(this,(string *)pBVar11);
    if ((RVar8.enum_ == Error) || (RVar8 = ParseBlock(this,pBVar11), RVar8.enum_ == Error))
    goto LAB_0013d052;
    bVar6 = Match(this,Else);
    if (bVar6) {
      RVar8 = ParseEndLabelOpt(this,(string *)pBVar11);
      if ((RVar8.enum_ == Error) ||
         (RVar8 = ParseTerminatingInstrList
                            (this,(ExprList *)&pEVar9[6].super_intrusive_list_base<wabt::Expr>),
         RVar8.enum_ == Error)) goto LAB_0013d052;
      GetToken((Token *)&local_b0,this);
      *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
       ((long)&pEVar9[6].loc.field_1 + 8) = local_b0.loc.field_1.field_1.offset;
      *(undefined8 *)&pEVar9[6].type_ = local_b0.loc.field_1._8_8_;
      pEVar9[6].loc.filename._M_str = (char *)local_b0.loc.filename._M_len;
      pEVar9[6].loc.field_1.field_1.offset = (size_t)local_b0.loc.filename._M_str;
    }
  }
  else {
    if (TVar7 != Loop) {
      if (TVar7 != Try) goto LAB_0013d093;
      Consume((Token *)&local_b0,this);
      ErrorUnlessOpcodeEnabled(this,(Token *)&local_b0);
      pEVar9 = (Expr *)operator_new(0x1e8);
      (pEVar9->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      (pEVar9->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      (pEVar9->loc).filename._M_len = sVar2;
      (pEVar9->loc).filename._M_str = pcVar3;
      (pEVar9->loc).field_1.field_1.offset = uVar4;
      *(undefined8 *)((long)&(pEVar9->loc).field_1 + 8) = uVar5;
      *(undefined8 *)&pEVar9->type_ = 0x3c;
      pEVar9->_vptr_Expr = (_func_int **)&PTR__TryExpr_0019b138;
      pBVar11 = (Block *)(pEVar9 + 1);
      Block::Block(pBVar11);
      pEVar9[6].loc.filename._M_len = 0;
      pEVar9[6].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
      pEVar9[6].super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
      this_00 = &pEVar9[6].loc.filename._M_str;
      Var::Var((Var *)this_00);
      local_68.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<wabt::Catch,_std::allocator<wabt::Catch>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      RVar8 = ParseLabelOpt(this,(string *)pBVar11);
      if ((RVar8.enum_ != Error) && (RVar8 = ParseBlock(this,pBVar11), RVar8.enum_ != Error)) {
        TVar7 = Peek(this,0);
        if (TVar7 - Catch < 2) {
          RVar8 = ParseCatchInstrList(this,(CatchVector *)
                                           &pEVar9[6].super_intrusive_list_base<wabt::Expr>);
          if (RVar8.enum_ == Error) goto LAB_0013d048;
          *(undefined4 *)&pEVar9->field_0x3c = 1;
        }
        else {
          TVar7 = Peek(this,0);
          if (TVar7 == Delegate) {
            Consume((Token *)&local_b0,this);
            Var::Var(&local_b0);
            RVar8 = ParseVar(this,&local_b0);
            if (RVar8.enum_ == Error) {
              Var::~Var(&local_b0);
              goto LAB_0013d048;
            }
            Var::operator=((Var *)this_00,&local_b0);
            *(undefined4 *)&pEVar9->field_0x3c = 2;
            Var::~Var(&local_b0);
          }
        }
        local_b0.loc.filename._M_len = (size_t)&local_b0.loc.field_1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"a valid try clause","")
        ;
        local_48 = 0;
        uStack_40 = 0;
        local_38 = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   &local_b0,&local_b0.type_);
        RVar8 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_48,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_48);
        if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_b0.loc.filename._M_len !=
            &local_b0.loc.field_1) {
          operator_delete((void *)local_b0.loc.filename._M_len,
                          (long)local_b0.loc.field_1.field_1.offset + 1);
        }
        if (RVar8.enum_ != Error) {
          GetToken((Token *)&local_b0,this);
          *(anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
           &pEVar9[5].type_ = local_b0.loc.field_1.field_1.offset;
          pEVar9[6]._vptr_Expr = (_func_int **)local_b0.loc.field_1._8_8_;
          pEVar9[5].loc.field_1.field_1.offset = local_b0.loc.filename._M_len;
          *(char **)((long)&pEVar9[5].loc.field_1 + 8) = local_b0.loc.filename._M_str;
          if (((*(int *)&pEVar9->field_0x3c == 2) ||
              (RVar8 = Expect(this,End), RVar8.enum_ != Error)) &&
             (RVar8 = ParseEndLabelOpt(this,(string *)pBVar11), RVar8.enum_ != Error)) {
            pEVar1 = (out_expr->_M_t).
                     super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                     super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                     super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
            (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
            _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
            super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar9;
            if (pEVar1 != (Expr *)0x0) {
              (*pEVar1->_vptr_Expr[1])();
            }
            std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::~vector(&local_68);
            return (Result)Ok;
          }
        }
      }
LAB_0013d048:
      std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::~vector(&local_68);
      goto LAB_0013d052;
    }
    Consume((Token *)&local_b0,this);
    pEVar9 = (Expr *)operator_new(0x188);
    (pEVar9->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar9->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar9->loc).filename._M_len = sVar2;
    (pEVar9->loc).filename._M_str = pcVar3;
    (pEVar9->loc).field_1.field_1.offset = uVar4;
    *(undefined8 *)((long)&(pEVar9->loc).field_1 + 8) = uVar5;
    pEVar9->type_ = Loop;
    ppuVar10 = &PTR__BlockExprBase_0019b098;
LAB_0013ce85:
    pEVar9->_vptr_Expr = (_func_int **)ppuVar10;
    pBVar11 = (Block *)(pEVar9 + 1);
    Block::Block(pBVar11);
    RVar8 = ParseLabelOpt(this,(string *)pBVar11);
    if ((RVar8.enum_ == Error) || (RVar8 = ParseBlock(this,pBVar11), RVar8.enum_ == Error))
    goto LAB_0013d052;
  }
  RVar8 = Expect(this,End);
  if ((RVar8.enum_ != Error) &&
     (RVar8 = ParseEndLabelOpt(this,&pBVar11->label), RVar8.enum_ != Error)) {
    pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar9;
    if (pEVar1 == (Expr *)0x0) {
      return (Result)Ok;
    }
    (*pEVar1->_vptr_Expr[1])();
    return (Result)Ok;
  }
LAB_0013d052:
  (*pEVar9->_vptr_Expr[1])(pEVar9);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseBlockInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParseBlockInstr);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Block: {
      Consume();
      auto expr = std::make_unique<BlockExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Loop: {
      Consume();
      auto expr = std::make_unique<LoopExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::If: {
      Consume();
      auto expr = std::make_unique<IfExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
      CHECK_RESULT(ParseBlock(&expr->true_));
      if (Match(TokenType::Else)) {
        CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
        CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
        expr->false_end_loc = GetLocation();
      }
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Try: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = std::make_unique<TryExpr>(loc);
      CatchVector catches;
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      if (IsCatch(Peek())) {
        CHECK_RESULT(ParseCatchInstrList(&expr->catches));
        expr->kind = TryKind::Catch;
      } else if (PeekMatch(TokenType::Delegate)) {
        Consume();
        Var var;
        CHECK_RESULT(ParseVar(&var));
        expr->delegate_target = var;
        expr->kind = TryKind::Delegate;
      }
      CHECK_RESULT(ErrorIfLpar({"a valid try clause"}));
      expr->block.end_loc = GetLocation();
      if (expr->kind != TryKind::Delegate) {
        EXPECT(End);
      }
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    default:
      assert(
          !"ParseBlockInstr should only be called when IsBlockInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}